

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluConfigInfo.cpp
# Opt level: O1

void eglu::queryCoreConfigInfo(Library *egl,EGLDisplay display,EGLConfig config,ConfigInfo *dst)

{
  deUint32 err;
  
  (*egl->_vptr_Library[0x19])();
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3024,&dst->redSize);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3023,&dst->greenSize);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3022,&dst->blueSize);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x303d,&dst->luminanceSize);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3021,&dst->alphaSize);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x303e,&dst->alphaMaskSize);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3039,&dst->bindToTextureRGB);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x303a,&dst->bindToTextureRGBA);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x303f,&dst->colorBufferType);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3027,&dst->configCaveat);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3028,&dst->configId);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3042,&dst->conformant);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3025,&dst->depthSize);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3029,&dst->level);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x302c,&dst->maxPbufferWidth);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x302a,&dst->maxPbufferHeight);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x303c,&dst->maxSwapInterval);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x303b,&dst->minSwapInterval);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x302d,&dst->nativeRenderable);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x302e,&dst->nativeVisualId);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x302f,&dst->nativeVisualType);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3040,&dst->renderableType);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3032,&dst->sampleBuffers);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3031,&dst->samples);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3026,&dst->stencilSize);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3033,&dst->surfaceType);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3034,&dst->transparentType);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3037,&dst->transparentRedValue);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3036,&dst->transparentGreenValue);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3035,&dst->transparentBlueValue);
  err = (*egl->_vptr_Library[0x1f])(egl);
  checkError(err,"Failed to query config info",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluConfigInfo.cpp"
             ,0x78);
  return;
}

Assistant:

void queryCoreConfigInfo (const Library& egl, EGLDisplay display, EGLConfig config, ConfigInfo* dst)
{
	egl.getConfigAttrib(display, config, EGL_BUFFER_SIZE,				&dst->bufferSize);
	egl.getConfigAttrib(display, config, EGL_RED_SIZE,					&dst->redSize);
	egl.getConfigAttrib(display, config, EGL_GREEN_SIZE,				&dst->greenSize);
	egl.getConfigAttrib(display, config, EGL_BLUE_SIZE,					&dst->blueSize);
	egl.getConfigAttrib(display, config, EGL_LUMINANCE_SIZE,			&dst->luminanceSize);
	egl.getConfigAttrib(display, config, EGL_ALPHA_SIZE,				&dst->alphaSize);
	egl.getConfigAttrib(display, config, EGL_ALPHA_MASK_SIZE,			&dst->alphaMaskSize);
	egl.getConfigAttrib(display, config, EGL_BIND_TO_TEXTURE_RGB,		(EGLint*)&dst->bindToTextureRGB);
	egl.getConfigAttrib(display, config, EGL_BIND_TO_TEXTURE_RGBA,		(EGLint*)&dst->bindToTextureRGBA);
	egl.getConfigAttrib(display, config, EGL_COLOR_BUFFER_TYPE,			(EGLint*)&dst->colorBufferType);
	egl.getConfigAttrib(display, config, EGL_CONFIG_CAVEAT,				(EGLint*)&dst->configCaveat);
	egl.getConfigAttrib(display, config, EGL_CONFIG_ID,					&dst->configId);
	egl.getConfigAttrib(display, config, EGL_CONFORMANT,				&dst->conformant);
	egl.getConfigAttrib(display, config, EGL_DEPTH_SIZE,				&dst->depthSize);
	egl.getConfigAttrib(display, config, EGL_LEVEL,						&dst->level);
	egl.getConfigAttrib(display, config, EGL_MAX_PBUFFER_WIDTH,			&dst->maxPbufferWidth);
	egl.getConfigAttrib(display, config, EGL_MAX_PBUFFER_HEIGHT,		&dst->maxPbufferHeight);
	egl.getConfigAttrib(display, config, EGL_MAX_SWAP_INTERVAL,			&dst->maxSwapInterval);
	egl.getConfigAttrib(display, config, EGL_MIN_SWAP_INTERVAL,			&dst->minSwapInterval);
	egl.getConfigAttrib(display, config, EGL_NATIVE_RENDERABLE,			(EGLint*)&dst->nativeRenderable);
	egl.getConfigAttrib(display, config, EGL_NATIVE_VISUAL_ID,			&dst->nativeVisualId);
	egl.getConfigAttrib(display, config, EGL_NATIVE_VISUAL_TYPE,		&dst->nativeVisualType);
	egl.getConfigAttrib(display, config, EGL_RENDERABLE_TYPE,			&dst->renderableType);
	egl.getConfigAttrib(display, config, EGL_SAMPLE_BUFFERS,			&dst->sampleBuffers);
	egl.getConfigAttrib(display, config, EGL_SAMPLES,					&dst->samples);
	egl.getConfigAttrib(display, config, EGL_STENCIL_SIZE,				&dst->stencilSize);
	egl.getConfigAttrib(display, config, EGL_SURFACE_TYPE,				&dst->surfaceType);
	egl.getConfigAttrib(display, config, EGL_TRANSPARENT_TYPE,			(EGLint*)&dst->transparentType);
	egl.getConfigAttrib(display, config, EGL_TRANSPARENT_RED_VALUE,		&dst->transparentRedValue);
	egl.getConfigAttrib(display, config, EGL_TRANSPARENT_GREEN_VALUE,	&dst->transparentGreenValue);
	egl.getConfigAttrib(display, config, EGL_TRANSPARENT_BLUE_VALUE,	&dst->transparentBlueValue);
	EGLU_CHECK_MSG(egl, "Failed to query config info");
}